

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCommonEdgeTests.cpp
# Opt level: O0

void __thiscall
vkt::tessellation::anon_unknown_0::initPrograms
          (anon_unknown_0 *this,SourceCollections *programCollection,CaseDefinition caseDef)

{
  uint uVar1;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *pPVar4;
  bool bVar5;
  bool bVar6;
  string local_7e0;
  ShaderSource local_7c0;
  allocator<char> local_791;
  string local_790;
  ostringstream local_770 [8];
  ostringstream src_3;
  string local_5f8;
  ShaderSource local_5d8;
  allocator<char> local_5a9;
  string local_5a8;
  ostringstream local_588 [8];
  ostringstream src_2;
  uint local_408;
  bool needPointSizeWrite;
  deUint32 variant;
  deUint32 numVariants;
  ShaderSource local_3e0;
  allocator<char> local_3b1;
  string local_3b0;
  ostringstream local_390 [8];
  ostringstream src_1;
  string local_218;
  ShaderSource local_1f8;
  allocator<char> local_1c9;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream src;
  SourceCollections *programCollection_local;
  CaseDefinition caseDef_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)local_198,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in  highp float in_v_attr;\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out highp float in_tc_attr;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    in_tc_attr = in_v_attr;\n");
  std::operator<<(poVar3,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"vert",&local_1c9);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)this,&local_1c8);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1f8,&local_218);
  glu::ProgramSources::operator<<(pPVar4,&local_1f8);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::__cxx11::ostringstream::ostringstream(local_390);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)local_390,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"#extension GL_EXT_tessellation_shader : require\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(vertices = 1) out;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in highp float in_tc_attr[];\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) patch out highp vec2 in_te_positionScale;\n"
                          );
  poVar3 = std::operator<<(poVar3,
                           "layout(location = 1) patch out highp vec2 in_te_positionOffset;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    in_te_positionScale  = vec2(in_tc_attr[6], in_tc_attr[7]);\n"
                          );
  poVar3 = std::operator<<(poVar3,"    in_te_positionOffset = vec2(in_tc_attr[8], in_tc_attr[9]);\n"
                          );
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelInner[0] = in_tc_attr[0];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelInner[1] = in_tc_attr[1];\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[0] = in_tc_attr[2];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[1] = in_tc_attr[3];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[2] = in_tc_attr[4];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[3] = in_tc_attr[5];\n");
  std::operator<<(poVar3,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"tesc",&local_3b1);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)this,&local_3b0);
  std::__cxx11::ostringstream::str();
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_3e0,(string *)&variant);
  glu::ProgramSources::operator<<(pPVar4,&local_3e0);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_3e0);
  std::__cxx11::string::~string((string *)&variant);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::ostringstream::~ostringstream(local_390);
  uVar1 = 1;
  if (((undefined1  [16])caseDef & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    uVar1 = 2;
  }
  for (local_408 = 0; local_408 < uVar1; local_408 = local_408 + 1) {
    bVar5 = ((undefined1  [16])caseDef & (undefined1  [16])0x100000000) != (undefined1  [16])0x0;
    bVar6 = local_408 == 1;
    std::__cxx11::ostringstream::ostringstream(local_588);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
    poVar3 = std::operator<<((ostream *)local_588,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"#extension GL_EXT_tessellation_shader : require\n");
    if (bVar5 && bVar6) {
      std::operator<<((ostream *)local_588,"#extension GL_EXT_tessellation_point_size : require\n");
    }
    poVar3 = std::operator<<((ostream *)local_588,"\n");
    poVar3 = std::operator<<(poVar3,"layout(");
    programCollection_local._0_4_ = (TessPrimitiveType)programCollection;
    pcVar2 = getTessPrimitiveTypeShaderName((TessPrimitiveType)programCollection_local);
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3,", ");
    programCollection_local._4_4_ = (SpacingMode)((ulong)programCollection >> 0x20);
    pcVar2 = getSpacingModeShaderName(programCollection_local._4_4_);
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3,", ");
    caseDef_local.primitiveType = caseDef.primitiveType;
    pcVar2 = getWindingShaderName(caseDef_local.primitiveType);
    poVar3 = std::operator<<(poVar3,pcVar2);
    pcVar2 = "";
    if (((undefined1  [16])caseDef & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      pcVar2 = ", point_mode";
    }
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3,") in;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,
                             "layout(location = 0) patch in highp vec2 in_te_positionScale;\n");
    poVar3 = std::operator<<(poVar3,
                             "layout(location = 1) patch in highp vec2 in_te_positionOffset;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,
                             "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n"
                            );
    poVar3 = std::operator<<(poVar3,"    int  numInvocations;\n");
    poVar3 = std::operator<<(poVar3,"} sb_out;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"    atomicAdd(sb_out.numInvocations, 1);\n");
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,
                    "    gl_Position = vec4(gl_TessCoord.xy*in_te_positionScale + in_te_positionOffset, 0.0, 1.0);\n"
                   );
    if (bVar5 && bVar6) {
      std::operator<<((ostream *)local_588,"    gl_PointSize = 1.0;\n");
    }
    std::operator<<((ostream *)local_588,"}\n");
    pcVar2 = "tese";
    if (bVar5 && bVar6) {
      pcVar2 = "tese_psw";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,pcVar2,&local_5a9);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)this,&local_5a8);
    std::__cxx11::ostringstream::str();
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_5d8,&local_5f8);
    glu::ProgramSources::operator<<(pPVar4,&local_5d8);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::allocator<char>::~allocator(&local_5a9);
    std::__cxx11::ostringstream::~ostringstream(local_588);
  }
  std::__cxx11::ostringstream::ostringstream(local_770);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)local_770,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out mediump vec4 o_color;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    o_color = vec4(1.0);\n");
  std::operator<<(poVar3,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_790,"frag",&local_791);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)this,&local_790);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_7c0,&local_7e0);
  glu::ProgramSources::operator<<(pPVar4,&local_7c0);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_790);
  std::allocator<char>::~allocator(&local_791);
  std::__cxx11::ostringstream::~ostringstream(local_770);
  return;
}

Assistant:

void initPrograms (vk::SourceCollections& programCollection, const CaseDefinition caseDef)
{
	DE_ASSERT(caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES || caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS);

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in highp vec2  in_v_position;\n"
			<< "layout(location = 1) in highp float in_v_tessParam;\n"
			<< "\n"
			<< "layout(location = 0) out highp vec2  in_tc_position;\n"
			<< "layout(location = 1) out highp float in_tc_tessParam;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_tc_position = in_v_position;\n"
			<< "    in_tc_tessParam = in_v_tessParam;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Tessellation control shader
	{
		const int numVertices = (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 4);

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< (caseDef.caseType == CASETYPE_PRECISE ? "#extension GL_EXT_gpu_shader5 : require\n" : "")
			<< "\n"
			<< "layout(vertices = " << numVertices << ") out;\n"
			<< "\n"
			<< "layout(location = 0) in highp vec2  in_tc_position[];\n"
			<< "layout(location = 1) in highp float in_tc_tessParam[];\n"
			<< "\n"
			<< "layout(location = 0) out highp vec2 in_te_position[];\n"
			<< "\n"
			<< (caseDef.caseType == CASETYPE_PRECISE ? "precise gl_TessLevelOuter;\n\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n"
			<< "\n"
			<< "    gl_TessLevelInner[0] = 5.0;\n"
			<< "    gl_TessLevelInner[1] = 5.0;\n"
			<< "\n"
			<< (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
				"    gl_TessLevelOuter[0] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[1] + in_tc_tessParam[2]);\n"
				"    gl_TessLevelOuter[1] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[2] + in_tc_tessParam[0]);\n"
				"    gl_TessLevelOuter[2] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[0] + in_tc_tessParam[1]);\n"
				: caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS ?
				"    gl_TessLevelOuter[0] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[0] + in_tc_tessParam[2]);\n"
				"    gl_TessLevelOuter[1] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[1] + in_tc_tessParam[0]);\n"
				"    gl_TessLevelOuter[2] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[3] + in_tc_tessParam[1]);\n"
				"    gl_TessLevelOuter[3] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[2] + in_tc_tessParam[3]);\n"
				: "")
			<< "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Tessellation evaluation shader
	{
		std::ostringstream primitiveSpecificCode;
		if (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			primitiveSpecificCode
			<< "    highp vec2 pos = gl_TessCoord.x*in_te_position[0] + gl_TessCoord.y*in_te_position[1] + gl_TessCoord.z*in_te_position[2];\n"
			<< "\n"
			<< "    highp float f = sqrt(3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z))) * 0.5 + 0.5;\n"
			<< "    in_f_color = vec4(gl_TessCoord*f, 1.0);\n";
		else if (caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS)
			primitiveSpecificCode
			<< (caseDef.caseType == CASETYPE_BASIC ?
				"    highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[0]\n"
				"                   + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[1]\n"
				"                   + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[2]\n"
				"                   + (    gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[3];\n"
				: caseDef.caseType == CASETYPE_PRECISE ?
				"    highp vec2 a = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[0];\n"
				"    highp vec2 b = (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[1];\n"
				"    highp vec2 c = (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[2];\n"
				"    highp vec2 d = (    gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[3];\n"
				"    highp vec2 pos = a+b+c+d;\n"
				: "")
			<< "\n"
			<< "    highp float f = sqrt(1.0 - 2.0 * max(abs(gl_TessCoord.x - 0.5), abs(gl_TessCoord.y - 0.5)))*0.5 + 0.5;\n"
			<< "    in_f_color = vec4(0.1, gl_TessCoord.xy*f, 1.0);\n";

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< (caseDef.caseType == CASETYPE_PRECISE ? "#extension GL_EXT_gpu_shader5 : require\n" : "")
			<< "\n"
			<< "layout(" << getTessPrimitiveTypeShaderName(caseDef.primitiveType) << ", "
						 << getSpacingModeShaderName(caseDef.spacingMode) << ") in;\n"
			<< "\n"
			<< "layout(location = 0) in highp vec2 in_te_position[];\n"
			<< "\n"
			<< "layout(location = 0) out mediump vec4 in_f_color;\n"
			<< "\n"
			<< (caseDef.caseType == CASETYPE_PRECISE ? "precise gl_Position;\n\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< primitiveSpecificCode.str()
			<< "\n"
			<< "    // Offset the position slightly, based on the parity of the bits in the float representation.\n"
			<< "    // This is done to detect possible small differences in edge vertex positions between patches.\n"
			<< "    uvec2 bits = floatBitsToUint(pos);\n"
			<< "    uint numBits = 0u;\n"
			<< "    for (uint i = 0u; i < 32u; i++)\n"
			<< "        numBits += ((bits[0] >> i) & 1u) + ((bits[1] >> i) & 1u);\n"
			<< "    pos += float(numBits&1u)*0.04;\n"
			<< "\n"
			<< "    gl_Position = vec4(pos, 0.0, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in mediump vec4 in_f_color;\n"
			<< "\n"
			<< "layout(location = 0) out mediump vec4 o_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    o_color = in_f_color;\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}